

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::resetAuxDegrees(Graph *this)

{
  Vertex *pVVar1;
  Edge *pEVar2;
  Vertex *pVVar3;
  Edge **ppEVar4;
  
  while (pVVar1 = this->verticesList, pVVar1 != (Vertex *)0x0) {
    ppEVar4 = &pVVar1->edgesList;
    while (pEVar2 = *ppEVar4, pEVar2 != (Edge *)0x0) {
      pVVar3 = pEVar2->destiny;
      pEVar2->origin->auxDegree = pEVar2->origin->indegree;
      pVVar3->auxDegree = pVVar3->indegree;
      ppEVar4 = &pEVar2->nextEdge;
    }
    this = (Graph *)&pVVar1->nextVertex;
  }
  return;
}

Assistant:

void Graph::resetAuxDegrees(){
    for(Vertex *v = this->verticesList; v!=NULL; v = v->getNext()){
        for(Edge *e = v->getEdgesList(); e!=NULL; e = e->getNext()){
            Vertex *orig, *dest;
            orig = e->getOrigin();
            dest = e->getDestiny();

            orig->setAuxDegree(orig->getOutdegree());
            dest->setAuxDegree(dest->getOutdegree());
        }
    }
}